

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_trust_anchors_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  bool bVar2;
  CBB list;
  CBB contents;
  CBB local_70;
  CBB local_40;
  
  bVar2 = true;
  if ((hs->config->requested_trust_anchors).
      super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
      super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true) {
    iVar1 = CBB_add_u16(out_compressible,0xca34);
    if ((((iVar1 == 0) ||
         (iVar1 = CBB_add_u16_length_prefixed(out_compressible,&local_40), iVar1 == 0)) ||
        (iVar1 = CBB_add_u16_length_prefixed(&local_40,&local_70), iVar1 == 0)) ||
       (iVar1 = CBB_add_bytes(&local_70,
                              (hs->config->requested_trust_anchors).
                              super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                              .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload.
                              _M_value.data_,
                              (hs->config->requested_trust_anchors).
                              super__Optional_base<bssl::Array<unsigned_char>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>
                              .super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload.
                              _M_value.size_), iVar1 == 0)) {
      bVar2 = false;
    }
    else {
      iVar1 = CBB_flush(out_compressible);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_trust_anchors_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                              CBB *out_compressible,
                                              ssl_client_hello_type_t type) {
  if (!hs->config->requested_trust_anchors.has_value()) {
    return true;
  }
  // TODO(crbug.com/398275713): What should this send in ClientHelloOuter?
  CBB contents, list;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_trust_anchors) ||  //
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||  //
      !CBB_add_u16_length_prefixed(&contents, &list) ||             //
      !CBB_add_bytes(&list, hs->config->requested_trust_anchors->data(),
                     hs->config->requested_trust_anchors->size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }
  return true;
}